

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string,char,char_const(&)[69],std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char_const(&)[171],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[41],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,char *b,
                   char (*args) [69],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [20],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [171],basic_string_view<char,_std::char_traits<char>_> *args_5,
                   char (*args_6) [41],basic_string_view<char,_std::char_traits<char>_> *args_7,
                   char (*args_8) [6])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_3a0;
  cmAlphaNum local_368;
  cmAlphaNum local_330;
  cmAlphaNum local_2f8;
  cmAlphaNum local_2c0;
  cmAlphaNum local_288;
  cmAlphaNum local_250;
  cmAlphaNum local_218;
  cmAlphaNum local_1e0;
  cmAlphaNum local_1a8;
  cmAlphaNum local_170;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_138;
  string_view local_120;
  string *local_110;
  string_view local_108;
  string *local_f8;
  string_view local_f0;
  string *local_e0;
  string_view local_d8;
  string *local_c8;
  string_view local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  string_view local_a8;
  string *local_98;
  string_view local_90;
  string *local_80;
  string_view local_78;
  string *local_68;
  string_view local_60;
  string *local_50;
  string_view local_48;
  string *local_38;
  
  local_170.View_._M_len = 0;
  local_170.View_._M_str = (char *)0x0;
  local_170.RValueString_ = a;
  local_138.first = cmAlphaNum::View(&local_170);
  local_138.second = local_170.RValueString_;
  local_3a0.Digits_[0] = *b;
  local_3a0.View_._M_str = local_3a0.Digits_;
  local_3a0.RValueString_ = (string *)0x0;
  local_3a0.View_._M_len = 1;
  local_120 = cmAlphaNum::View(&local_3a0);
  local_110 = local_3a0.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_1a8,*args);
  local_108 = cmAlphaNum::View(&local_1a8);
  local_f8 = local_1a8.RValueString_;
  local_1e0.RValueString_ = (string *)0x0;
  local_1e0.View_._M_str = (args_1->_M_dataplus)._M_p;
  local_1e0.View_._M_len = args_1->_M_string_length;
  local_f0 = cmAlphaNum::View(&local_1e0);
  local_e0 = local_1e0.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_218,*args_2);
  local_d8 = cmAlphaNum::View(&local_218);
  local_c8 = local_218.RValueString_;
  local_250.RValueString_ = args_3;
  local_250.View_._M_len = 0;
  local_250.View_._M_str = (char *)0x0;
  local_c0 = cmAlphaNum::View(&local_250);
  local_b0 = local_250.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_288,*args_4);
  local_a8 = cmAlphaNum::View(&local_288);
  local_98 = local_288.RValueString_;
  local_2c0.View_._M_len = args_5->_M_len;
  local_2c0.View_._M_str = args_5->_M_str;
  local_2c0.RValueString_ = (string *)0x0;
  local_90 = cmAlphaNum::View(&local_2c0);
  local_80 = local_2c0.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_2f8,*args_6);
  local_78 = cmAlphaNum::View(&local_2f8);
  local_68 = local_2f8.RValueString_;
  local_330.View_._M_len = args_7->_M_len;
  local_330.View_._M_str = args_7->_M_str;
  local_330.RValueString_ = (string *)0x0;
  local_60 = cmAlphaNum::View(&local_330);
  local_50 = local_330.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_368,*args_8);
  local_48 = cmAlphaNum::View(&local_368);
  local_38 = local_368.RValueString_;
  views._M_len = 0xb;
  views._M_array = &local_138;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}